

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_stop_dsp(void)

{
  t_symbol *ptVar1;
  
  if ((pd_maininstance.pd_gui)->i_dspstate != 0) {
    ugen_stop();
    pdgui_vmess("pdtk_pd_dsp","s","OFF");
    (pd_maininstance.pd_gui)->i_dspstate = 0;
    canvas_dspstate = 0;
    ptVar1 = gensym("pd-dsp-stopped");
    if (ptVar1->s_thing != (_class **)0x0) {
      ptVar1 = gensym("pd-dsp-stopped");
      pd_bang(ptVar1->s_thing);
    }
  }
  return;
}

Assistant:

static void canvas_stop_dsp(void)
{
    if (THISGUI->i_dspstate)
    {
        ugen_stop();
        pdgui_vmess("pdtk_pd_dsp", "s", "OFF");
        canvas_dspstate = THISGUI->i_dspstate = 0;
        if (gensym("pd-dsp-stopped")->s_thing)
            pd_bang(gensym("pd-dsp-stopped")->s_thing);
    }
}